

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request_parser.cc
# Opt level: O0

void __thiscall iqxmlrpc::RequestBuilder::do_visit_element(RequestBuilder *this,string *tagname)

{
  int iVar1;
  Value_type *v;
  Value local_58 [2];
  string local_38;
  string *local_18;
  string *tagname_local;
  RequestBuilder *this_local;
  
  local_18 = tagname;
  tagname_local = (string *)this;
  iVar1 = StateMachine::change(&this->state_,tagname);
  if (iVar1 == 2) {
    Parser::get_data_abi_cxx11_(&local_38,(this->super_BuilderBase).parser_);
    boost::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&this->method_name_,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else if (iVar1 == 5) {
    v = BuilderBase::sub_build<iqxmlrpc::Value_type*,iqxmlrpc::ValueBuilder>
                  (&this->super_BuilderBase,true);
    Value::Value(local_58,v);
    std::vector<iqxmlrpc::Value,_std::allocator<iqxmlrpc::Value>_>::push_back
              (&this->params_,local_58);
    Value::~Value(local_58);
  }
  return;
}

Assistant:

void
RequestBuilder::do_visit_element(const std::string& tagname)
{
  switch (state_.change(tagname)) {
  case METHOD_NAME:
    method_name_ = parser_.get_data();
    break;

  case VALUE:
    params_.push_back(sub_build<Value_type*, ValueBuilder>(true));
    break;
  }
}